

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O3

void __thiscall mocker::SSADestruction::insertAllocas(SSADestruction *this)

{
  FunctionModule *pFVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  SSADestruction *pSVar4;
  mapped_type *pmVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  undefined8 __k;
  shared_ptr<mocker::ir::Reg> addr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varNames;
  undefined1 local_a1;
  _List_node_base *local_a0;
  pointer local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  long local_88 [2];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pointer local_58;
  shared_ptr<mocker::ir::IRInst> local_48;
  SSADestruction *local_38;
  
  local_68._M_allocated_capacity = 0;
  local_68._8_8_ = (key_type *)0x0;
  local_58 = (pointer)0x0;
  pFVar1 = (this->super_FuncPass).func;
  p_Var7 = (pFVar1->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  local_a0 = (_List_node_base *)&pFVar1->bbs;
  if (p_Var7 != local_a0) {
    local_38 = this;
    do {
      p_Var6 = p_Var7[1]._M_prev;
      while ((pSVar4 = local_38, uVar3 = local_68._8_8_,
             p_Var6 != (_List_node_base *)&p_Var7[1]._M_prev &&
             (p_Var2 = p_Var6[1]._M_next, *(int *)&p_Var2->_M_prev == 0xf))) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[1]._M_prev;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (local_78 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(*(_List_node_base **)((long)(p_Var2 + 1) + 8))->_M_prev);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        p_Var6 = p_Var6->_M_next;
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != local_a0);
    if (local_68._M_allocated_capacity != local_68._8_8_) {
      local_a0 = (_List_node_base *)&local_38->addresses;
      __k = local_68._M_allocated_capacity;
      do {
        pFVar1 = (pSVar4->super_FuncPass).func;
        local_98 = (pointer)local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
        ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_78,&pFVar1->identifier);
        if (local_98 != (pointer)local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_a0,(key_type *)__k);
        (pmVar5->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)local_78._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar5->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
        p_Var7 = (((pSVar4->super_FuncPass).func)->bbs).
                 super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
        local_98 = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
                  (&_Stack_90,(Alloca **)&local_98,(allocator<mocker::ir::Alloca> *)&local_a1,
                   (shared_ptr<mocker::ir::Reg> *)local_78);
        local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_98;
        local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_90._M_pi;
        local_98 = (pointer)0x0;
        _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ir::BasicBlock::appendInstFront
                  ((BasicBlock *)(p_Var7 + 1),(shared_ptr<mocker::ir::IRInst> *)(local_78 + 0x30));
        if (local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
        }
        __k = __k + 0x20;
      } while (__k != uVar3);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_78 + 0x10));
  return;
}

Assistant:

void SSAConstruction::renameVariables() {
  for (const auto &name : varNames)
    reachingDef[name] = ".phi_nan";
  bbDefined[".phi_nan"] = func.getFirstBB()->getLabelID();

  renameVariablesImpl(func.getFirstBBLabel());
}